

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlv.cpp
# Opt level: O0

void __thiscall ot::commissioner::tlv::Tlv::Tlv(Tlv *this,Type aType,uint32_t aValue,Scope aScope)

{
  ByteArray local_38;
  Scope local_19;
  uint local_18;
  Scope aScope_local;
  uint32_t aValue_local;
  Type aType_local;
  Tlv *this_local;
  
  this->mScope = aScope;
  this->mType = aType;
  local_19 = aScope;
  local_18 = aValue;
  aScope_local = aType;
  _aValue_local = this;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->mValue);
  utils::Encode<unsigned_int>(&local_38,local_18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&this->mValue,&local_38);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_38);
  return;
}

Assistant:

Tlv::Tlv(Type aType, uint32_t aValue, Scope aScope)
    : mScope(aScope)
    , mType(aType)
{
    mValue = utils::Encode(aValue);
}